

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void fprint_stone_identifier(FILE *out,event_path_data evp,int stone_num)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  if (stone_num < 0) {
    uVar1 = lookup_local_stone(evp,stone_num);
    uVar2 = (ulong)uVar1;
  }
  else {
    if (0 < (long)evp->stone_lookup_table_size) {
      lVar3 = 0;
      do {
        if (evp->stone_lookup_table[lVar3].local_id == stone_num) {
          uVar2 = (ulong)(uint)stone_num;
          stone_num = evp->stone_lookup_table[lVar3].global_id;
          goto LAB_0012e80e;
        }
        lVar3 = lVar3 + 1;
      } while (evp->stone_lookup_table_size != lVar3);
    }
    uVar2 = (ulong)(uint)stone_num;
    stone_num = 0xffffffff;
  }
LAB_0012e80e:
  fprintf((FILE *)out,"local stone number %x",uVar2);
  if (stone_num != 0xffffffff) {
    fprintf((FILE *)out," (global %x)",(ulong)(uint)stone_num);
    return;
  }
  return;
}

Assistant:

static void
fprint_stone_identifier(FILE *out, event_path_data evp, int stone_num)
{
    int local_stone_num = -1;
    int global_stone_num = -1;
    if ((stone_num & 0x80000000) == 0x80000000) {
	local_stone_num = lookup_local_stone(evp, stone_num);
	global_stone_num = stone_num;
    } else {
	int i;
	local_stone_num = stone_num;
	for (i=0; i < evp->stone_lookup_table_size; i++) {
	    if (evp->stone_lookup_table[i].local_id == stone_num) {
		global_stone_num = evp->stone_lookup_table[i].global_id;
		break;
	    }
	}
    }
    fprintf(out, "local stone number %x", local_stone_num);
    if (global_stone_num != -1) {
	fprintf(out, " (global %x)", global_stone_num);
    }
}